

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::detail::format_value<char,diy::DynamicPoint<float,4ul>>
               (buffer<char> *buf,DynamicPoint<float,_4UL> *value,locale_ref loc)

{
  bool bVar1;
  buffer<char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> output;
  formatbuf<char> format_buf;
  buffer<char> *in_stack_fffffffffffffe48;
  _Ios_Iostate _Var2;
  formatbuf<char> *in_stack_fffffffffffffe50;
  locale_ref *in_stack_fffffffffffffe58;
  buffer<char> *in_stack_fffffffffffffe60;
  undefined1 local_190 [32];
  locale_ref local_170 [34];
  streambuf local_60 [80];
  buffer<char> *local_10;
  locale_ref local_8;
  
  local_10 = in_RDI;
  formatbuf<char>::formatbuf(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::ostream::ostream(local_170,local_60);
  bVar1 = locale_ref::operator_cast_to_bool(&local_8);
  if (bVar1) {
    in_stack_fffffffffffffe58 =
         (locale_ref *)((long)&local_170[0].locale_ + *(long *)((long)local_170[0].locale_ + -0x18))
    ;
    in_stack_fffffffffffffe60 = (buffer<char> *)local_190;
    locale_ref::get<std::locale>(in_stack_fffffffffffffe58);
    std::ios::imbue((locale *)(local_190 + 8));
    std::locale::~locale((locale *)(local_190 + 8));
    std::locale::~locale((locale *)local_190);
  }
  diy::operator<<((ostream *)in_stack_fffffffffffffe50,
                  (DynamicPoint<float,_4UL> *)in_stack_fffffffffffffe48);
  _Var2 = (int)local_170 + (int)*(undefined8 *)((long)local_170[0].locale_ + -0x18);
  Catch::clara::std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions(_Var2);
  buffer<char>::size(local_10);
  buffer<char>::try_resize(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  std::ostream::~ostream(local_170);
  formatbuf<char>::~formatbuf((formatbuf<char> *)0x20e730);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
#if !defined(FMT_STATIC_THOUSANDS_SEPARATOR)
  if (loc) output.imbue(loc.get<std::locale>());
#endif
  output << value;
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  buf.try_resize(buf.size());
}